

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

RegOpnd * __thiscall IRBuilderAsmJs::BuildIntConstOpnd(IRBuilderAsmJs *this,RegSlot regSlot)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  RegSlot lhs;
  uint32 uVar4;
  JITTimeFunctionBody *pJVar5;
  void *pvVar6;
  AsmJsJITInfo *this_00;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  TypedSlotInfo local_44;
  
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  pvVar6 = JITTimeFunctionBody::GetConstTable(pJVar5);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
  AsmJsJITInfo::GetTypedSlotInfo(&local_44,this_00,INT32);
  if (local_44.constSrcByteOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15e,"(info.constSrcByteOffset != Js::Constants::InvalidOffset)",
                       "info.constSrcByteOffset != Js::Constants::InvalidOffset");
    if (!bVar3) goto LAB_004b7995;
    *puVar7 = 0;
  }
  TVar2 = local_44.constSrcByteOffset;
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  lhs = JITTimeFunctionBody::GetConstCount(pJVar5);
  uVar4 = UInt32Math::Mul<8u>(lhs);
  if (uVar4 <= TVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15f,
                       "(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                       ,
                       "info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                      );
    if (!bVar3) goto LAB_004b7995;
    *puVar7 = 0;
  }
  uVar4 = GetTypedRegFromRegSlot(this,regSlot,INT32);
  if ((uVar4 == 0) || (local_44.constCount <= uVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x162,
                       "(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount)",
                       "srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount");
    if (!bVar3) {
LAB_004b7995:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  pIVar8 = IR::IntConstOpnd::New
                     ((long)*(int *)((long)pvVar6 +
                                    (ulong)uVar4 * 4 + (ulong)local_44.constSrcByteOffset),TyInt32,
                      this->m_func,false);
  return (RegOpnd *)pIVar8;
}

Assistant:

IR::RegOpnd *
IRBuilderAsmJs::BuildIntConstOpnd(Js::RegSlot regSlot)
{
    Js::Var * constTable = (Js::Var*)m_func->GetJITFunctionBody()->GetConstTable();
    const WAsmJs::TypedSlotInfo& info = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTypedSlotInfo(WAsmJs::INT32);
    Assert(info.constSrcByteOffset != Js::Constants::InvalidOffset);
    AssertOrFailFast(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()));
    int* intConstTable = reinterpret_cast<int*>(((byte*)constTable) + info.constSrcByteOffset);
    uint32 srcReg = GetTypedRegFromRegSlot(regSlot, WAsmJs::INT32);
    AssertOrFailFast(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount);
    const int32 value = intConstTable[srcReg];
    IR::IntConstOpnd *opnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

    return (IR::RegOpnd*)opnd;
}